

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

void __thiscall QSqlRelationalTableModel::clear(QSqlRelationalTableModel *this)

{
  QSqlRelationalTableModelPrivate *this_00;
  
  this_00 = *(QSqlRelationalTableModelPrivate **)(this + 8);
  QSqlQueryModel::beginResetModel((QSqlQueryModel *)this);
  QSqlRelationalTableModelPrivate::clearChanges(this_00);
  QList<QSharedPointer<QRelation>_>::clear(&this_00->relations);
  QSqlTableModel::clear((QSqlTableModel *)this);
  QSqlQueryModel::endResetModel((QSqlQueryModel *)this);
  return;
}

Assistant:

void QSqlRelationalTableModel::clear()
{
    Q_D(QSqlRelationalTableModel);
    beginResetModel();
    d->clearChanges();
    d->relations.clear();
    QSqlTableModel::clear();
    endResetModel();
}